

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawTiltedSpanPalCommand::Execute(DrawTiltedSpanPalCommand *this,DrawerThread *thread)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint8_t *puVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  int width_00;
  int iVar8;
  uint uVar9;
  float *pfVar10;
  double dVar11;
  double dVar12;
  uint32_t stepv_1;
  uint32_t stepu_1;
  double endv_1;
  double endu_1;
  double endz_1;
  double left;
  uint32_t stepv;
  uint32_t stepu;
  double endv;
  double endu;
  double endz;
  double vzstep;
  double uzstep;
  double izstep;
  double startv;
  double startu;
  double startz;
  int umask;
  uint8_t ushift;
  int iStack_54;
  uint8_t vshift;
  int i_1;
  int i;
  uint32_t v;
  uint32_t u;
  uint8_t *fb;
  double vz;
  double uz;
  double iz;
  int width;
  uint8_t **tiltlighting;
  DrawerThread *thread_local;
  DrawTiltedSpanPalCommand *this_local;
  
  bVar5 = DrawerThread::line_skipped_by_thread
                    (thread,*(int *)&(this->super_DrawerCommand).field_0xc);
  if (!bVar5) {
    width_00 = this->x2 - this->x1;
    pfVar10 = TVector3<float>::operator[](&this->plane_sz,2);
    fVar1 = *pfVar10;
    pfVar10 = TVector3<float>::operator[](&this->plane_sz,1);
    fVar2 = *pfVar10;
    iVar8 = centery - *(int *)&(this->super_DrawerCommand).field_0xc;
    pfVar10 = TVector3<float>::operator[](&this->plane_sz,0);
    uz = (double)(fVar1 + fVar2 * (float)iVar8 + *pfVar10 * (float)(this->x1 - centerx));
    if ((this->plane_shade & 1U) == 0) {
      for (umask = 0; umask < width_00; umask = umask + 1) {
        thread->tiltlighting[umask] = this->_colormap;
      }
    }
    else {
      pfVar10 = TVector3<float>::operator[](&this->plane_sz,0);
      CalcTiltedLighting(this,uz * (double)this->planelightfloat,
                         (uz + (double)(*pfVar10 * (float)width_00)) * (double)this->planelightfloat
                         ,width_00,thread);
    }
    pfVar10 = TVector3<float>::operator[](&this->plane_su,2);
    fVar1 = *pfVar10;
    pfVar10 = TVector3<float>::operator[](&this->plane_su,1);
    fVar2 = *pfVar10;
    iVar8 = centery - *(int *)&(this->super_DrawerCommand).field_0xc;
    pfVar10 = TVector3<float>::operator[](&this->plane_su,0);
    vz = (double)(fVar1 + fVar2 * (float)iVar8 + *pfVar10 * (float)(this->x1 - centerx));
    pfVar10 = TVector3<float>::operator[](&this->plane_sv,2);
    fVar1 = *pfVar10;
    pfVar10 = TVector3<float>::operator[](&this->plane_sv,1);
    fVar2 = *pfVar10;
    iVar8 = centery - *(int *)&(this->super_DrawerCommand).field_0xc;
    pfVar10 = TVector3<float>::operator[](&this->plane_sv,0);
    fb = (uint8_t *)(double)(fVar1 + fVar2 * (float)iVar8 + *pfVar10 * (float)(this->x1 - centerx));
    iVar8 = *(int *)(ylookup + (long)*(int *)&(this->super_DrawerCommand).field_0xc * 4) + this->x1;
    puVar4 = this->_destorg;
    bVar6 = 0x20 - (char)this->_ybits;
    bVar7 = bVar6 - (char)this->_xbits;
    uVar9 = (1 << ((byte)this->_xbits & 0x1f)) + -1 << ((byte)this->_ybits & 0x1f);
    pfVar10 = TVector3<float>::operator[](&this->plane_sz,0);
    fVar1 = *pfVar10;
    pfVar10 = TVector3<float>::operator[](&this->plane_su,0);
    fVar2 = *pfVar10;
    pfVar10 = TVector3<float>::operator[](&this->plane_sv,0);
    fVar3 = *pfVar10;
    this->x1 = 0;
    izstep = (double)fb * (1.0 / uz);
    startv = vz * (1.0 / uz);
    for (iz._4_4_ = width_00 + 1; 0xf < iz._4_4_; iz._4_4_ = iz._4_4_ + -0x10) {
      uz = (double)(fVar1 * 16.0) + uz;
      vz = (double)(fVar2 * 16.0) + vz;
      fb = (uint8_t *)((double)(fVar3 * 16.0) + (double)fb);
      dVar11 = vz * (1.0 / uz);
      dVar12 = (double)fb * (1.0 / uz);
      i = (int)(long)startv + this->pviewx;
      i_1 = (int)(long)izstep + this->pviewy;
      for (iStack_54 = 0xf; -1 < iStack_54; iStack_54 = iStack_54 + -1) {
        puVar4[(long)this->x1 + (long)iVar8] =
             thread->tiltlighting[this->x1]
             [(int)(uint)this->_source
                         [(uint)i_1 >> (bVar6 & 0x1f) | (uint)i >> (bVar7 & 0x1f) & uVar9]];
        this->x1 = this->x1 + 1;
        i = (int)(long)((dVar11 - startv) * 0.0625) + i;
        i_1 = (int)(long)((dVar12 - izstep) * 0.0625) + i_1;
      }
      izstep = dVar12;
      startv = dVar11;
    }
    if (0 < iz._4_4_) {
      if (iz._4_4_ == 1) {
        puVar4[(long)this->x1 + (long)iVar8] =
             thread->tiltlighting[this->x1]
             [(int)(uint)this->_source
                         [(uint)(long)izstep >> (bVar6 & 0x1f) |
                          (uint)(long)startv >> (bVar7 & 0x1f) & uVar9]];
      }
      else {
        dVar11 = (double)iz._4_4_;
        pfVar10 = TVector3<float>::operator[](&this->plane_sz,0);
        fVar1 = *pfVar10;
        pfVar10 = TVector3<float>::operator[](&this->plane_su,0);
        fVar2 = *pfVar10;
        pfVar10 = TVector3<float>::operator[](&this->plane_sv,0);
        fVar3 = *pfVar10;
        dVar12 = 1.0 / ((double)fVar1 * dVar11 + uz);
        i = (int)(long)startv + this->pviewx;
        i_1 = (int)(long)izstep + this->pviewy;
        for (; iz._4_4_ != 0; iz._4_4_ = iz._4_4_ + -1) {
          puVar4[(long)this->x1 + (long)iVar8] =
               thread->tiltlighting[this->x1]
               [(int)(uint)this->_source
                           [(uint)i_1 >> (bVar6 & 0x1f) | (uint)i >> (bVar7 & 0x1f) & uVar9]];
          this->x1 = this->x1 + 1;
          i = (int)(long)((((double)fVar2 * dVar11 + vz) * dVar12 - startv) * (1.0 / dVar11)) + i;
          i_1 = (int)(long)((((double)fVar3 * dVar11 + (double)fb) * dVar12 - izstep) *
                           (1.0 / dVar11)) + i_1;
        }
      }
    }
  }
  return;
}

Assistant:

void DrawTiltedSpanPalCommand::Execute(DrawerThread *thread)
	{
		if (thread->line_skipped_by_thread(y))
			return;

		const uint8_t **tiltlighting = thread->tiltlighting;

		int width = x2 - x1;
		double iz, uz, vz;
		uint8_t *fb;
		uint32_t u, v;
		int i;

		iz = plane_sz[2] + plane_sz[1] * (centery - y) + plane_sz[0] * (x1 - centerx);

		// Lighting is simple. It's just linear interpolation from start to end
		if (plane_shade)
		{
			uz = (iz + plane_sz[0] * width) * planelightfloat;
			vz = iz * planelightfloat;
			CalcTiltedLighting(vz, uz, width, thread);
		}
		else
		{
			for (int i = 0; i < width; ++i)
			{
				tiltlighting[i] = _colormap;
			}
		}

		uz = plane_su[2] + plane_su[1] * (centery - y) + plane_su[0] * (x1 - centerx);
		vz = plane_sv[2] + plane_sv[1] * (centery - y) + plane_sv[0] * (x1 - centerx);

		fb = ylookup[y] + x1 + _destorg;

		uint8_t vshift = 32 - _ybits;
		uint8_t ushift = vshift - _xbits;
		int umask = ((1 << _xbits) - 1) << _ybits;

		#if 0
		// The "perfect" reference version of this routine. Pretty slow.
		// Use it only to see how things are supposed to look.
		i = 0;
		do
		{
			double z = 1.f / iz;

			u = int64_t(uz*z) + pviewx;
			v = int64_t(vz*z) + pviewy;
			R_SetDSColorMapLight(tiltlighting[i], 0, 0);
			fb[i++] = ds_colormap[ds_source[(v >> vshift) | ((u >> ushift) & umask)]];
			iz += plane_sz[0];
			uz += plane_su[0];
			vz += plane_sv[0];
		} while (--width >= 0);
		#else
		//#define SPANSIZE 32
		//#define INVSPAN 0.03125f
		//#define SPANSIZE 8
		//#define INVSPAN 0.125f
		#define SPANSIZE 16
		#define INVSPAN	0.0625f

		double startz = 1.f / iz;
		double startu = uz*startz;
		double startv = vz*startz;
		double izstep, uzstep, vzstep;

		izstep = plane_sz[0] * SPANSIZE;
		uzstep = plane_su[0] * SPANSIZE;
		vzstep = plane_sv[0] * SPANSIZE;
		x1 = 0;
		width++;

		while (width >= SPANSIZE)
		{
			iz += izstep;
			uz += uzstep;
			vz += vzstep;

			double endz = 1.f / iz;
			double endu = uz*endz;
			double endv = vz*endz;
			uint32_t stepu = (uint32_t)int64_t((endu - startu) * INVSPAN);
			uint32_t stepv = (uint32_t)int64_t((endv - startv) * INVSPAN);
			u = (uint32_t)(int64_t(startu) + pviewx);
			v = (uint32_t)(int64_t(startv) + pviewy);

			for (i = SPANSIZE - 1; i >= 0; i--)
			{
				fb[x1] = *(tiltlighting[x1] + _source[(v >> vshift) | ((u >> ushift) & umask)]);
				x1++;
				u += stepu;
				v += stepv;
			}
			startu = endu;
			startv = endv;
			width -= SPANSIZE;
		}
		if (width > 0)
		{
			if (width == 1)
			{
				u = (uint32_t)int64_t(startu);
				v = (uint32_t)int64_t(startv);
				fb[x1] = *(tiltlighting[x1] + _source[(v >> vshift) | ((u >> ushift) & umask)]);
			}
			else
			{
				double left = width;
				iz += plane_sz[0] * left;
				uz += plane_su[0] * left;
				vz += plane_sv[0] * left;

				double endz = 1.f / iz;
				double endu = uz*endz;
				double endv = vz*endz;
				left = 1.f / left;
				uint32_t stepu = (uint32_t)int64_t((endu - startu) * left);
				uint32_t stepv = (uint32_t)int64_t((endv - startv) * left);
				u = (uint32_t)(int64_t(startu) + pviewx);
				v = (uint32_t)(int64_t(startv) + pviewy);

				for (; width != 0; width--)
				{
					fb[x1] = *(tiltlighting[x1] + _source[(v >> vshift) | ((u >> ushift) & umask)]);
					x1++;
					u += stepu;
					v += stepv;
				}
			}
		}
		#endif
	}